

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::FeatureType::FeatureType(FeatureType *this,FeatureType *from)

{
  TypeCase TVar1;
  InternalMetadataWithArenaLite *this_00;
  Int64FeatureType *this_01;
  Int64FeatureType *from_00;
  DoubleFeatureType *this_02;
  DoubleFeatureType *from_01;
  StringFeatureType *this_03;
  StringFeatureType *from_02;
  ImageFeatureType *this_04;
  ImageFeatureType *from_03;
  ArrayFeatureType *this_05;
  ArrayFeatureType *from_04;
  DictionaryFeatureType *this_06;
  DictionaryFeatureType *from_05;
  SequenceFeatureType *this_07;
  SequenceFeatureType *from_06;
  FeatureType *from_local;
  FeatureType *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__FeatureType_00624a78;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  TypeUnion::TypeUnion((TypeUnion *)&this->Type_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  this->isoptional_ = (bool)(from->isoptional_ & 1);
  clear_has_Type(this);
  TVar1 = Type_case(from);
  switch(TVar1) {
  case TYPE_NOT_SET:
    break;
  case kInt64Type:
    this_01 = mutable_int64type(this);
    from_00 = int64type(from);
    Int64FeatureType::MergeFrom(this_01,from_00);
    break;
  case kDoubleType:
    this_02 = mutable_doubletype(this);
    from_01 = doubletype(from);
    DoubleFeatureType::MergeFrom(this_02,from_01);
    break;
  case kStringType:
    this_03 = mutable_stringtype(this);
    from_02 = stringtype(from);
    StringFeatureType::MergeFrom(this_03,from_02);
    break;
  case kImageType:
    this_04 = mutable_imagetype(this);
    from_03 = imagetype(from);
    ImageFeatureType::MergeFrom(this_04,from_03);
    break;
  case kMultiArrayType:
    this_05 = mutable_multiarraytype(this);
    from_04 = multiarraytype(from);
    ArrayFeatureType::MergeFrom(this_05,from_04);
    break;
  case kDictionaryType:
    this_06 = mutable_dictionarytype(this);
    from_05 = dictionarytype(from);
    DictionaryFeatureType::MergeFrom(this_06,from_05);
    break;
  case kSequenceType:
    this_07 = mutable_sequencetype(this);
    from_06 = sequencetype(from);
    SequenceFeatureType::MergeFrom(this_07,from_06);
  }
  return;
}

Assistant:

FeatureType::FeatureType(const FeatureType& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  isoptional_ = from.isoptional_;
  clear_has_Type();
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kDoubleType: {
      mutable_doubletype()->::CoreML::Specification::DoubleFeatureType::MergeFrom(from.doubletype());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case kImageType: {
      mutable_imagetype()->::CoreML::Specification::ImageFeatureType::MergeFrom(from.imagetype());
      break;
    }
    case kMultiArrayType: {
      mutable_multiarraytype()->::CoreML::Specification::ArrayFeatureType::MergeFrom(from.multiarraytype());
      break;
    }
    case kDictionaryType: {
      mutable_dictionarytype()->::CoreML::Specification::DictionaryFeatureType::MergeFrom(from.dictionarytype());
      break;
    }
    case kSequenceType: {
      mutable_sequencetype()->::CoreML::Specification::SequenceFeatureType::MergeFrom(from.sequencetype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.FeatureType)
}